

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O3

uint __thiscall VolumeFile::getNodeByPath(VolumeFile *this,string *filePath,NodeKey *nodeKey)

{
  pointer puVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  size_type sVar5;
  size_type sVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  pointer pbVar11;
  NodeBTree nodeBtree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  EntryBTree entryBtree;
  StringKey nameKey;
  StringBTree extBtree;
  StringBTree nameBtree;
  string normalizedFilePath;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  long local_c8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  StringKey local_a0;
  NodeKey *local_90;
  StringKey local_88;
  BTree<StringBTree,_StringKey> local_78;
  BTree<StringBTree,_StringKey> local_70;
  anon_union_16_2_ba345be5_for_m_Storage local_68;
  ulong local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->m_entryTreeCount == 0) {
    uVar9 = 0xffffffff;
  }
  else {
    (*this->_vptr_VolumeFile[5])(&local_50,this,filePath);
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8 = (undefined1  [8])0x168375;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d0 = "";
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_68,(iterator_range<const_char_*> *)local_d8);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
              (&local_b8,&local_50,(is_any_ofF<char> *)&local_68,token_compress_on);
    if ((0x10 < local_58) && (local_68.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_68.m_dynSet);
    }
    if (local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      puVar1 = (this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = 1;
      uVar10 = 0;
      uVar8 = 0;
      local_70.m_data = puVar1 + this->m_nameTreeOffset;
      local_78.m_data = puVar1 + this->m_extTreeOffset;
      local_90 = nodeKey;
      do {
        pbVar11 = local_b8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar10;
        sVar5 = std::__cxx11::string::rfind((char)pbVar11,0x2e);
        sVar6 = sVar5;
        if (sVar5 == 0xffffffffffffffff) {
          sVar6 = pbVar11->_M_string_length;
        }
        local_88.m_value = (pbVar11->_M_dataplus)._M_p;
        local_88.m_length = 0;
        uVar2 = (uint)sVar6;
        if (uVar2 == 0xffffffff) {
          sVar7 = strlen(local_88.m_value);
          uVar2 = (uint)sVar7;
        }
        local_88.m_length = uVar2;
        uVar2 = BTree<StringBTree,_StringKey>::searchByKey(&local_70,&local_88);
        if (uVar2 == 0xffffffff) break;
        if (sVar5 == 0xffffffffffffffff) {
          uVar4 = 0;
        }
        else {
          std::__cxx11::string::substr((ulong)local_d8,(ulong)pbVar11);
          local_a0.m_length = 0;
          local_a0.m_value = (char *)local_d8;
          uVar3 = (uint32_t)local_d0;
          if ((uint32_t)local_d0 == 0xffffffff) {
            sVar7 = strlen((char *)local_d8);
            uVar3 = (uint32_t)sVar7;
          }
          local_a0.m_length = uVar3;
          uVar4 = BTree<StringBTree,_StringKey>::searchByKey(&local_78,&local_a0);
          if (local_d8 != (undefined1  [8])local_c8) {
            operator_delete((void *)local_d8,local_c8[0] + 1);
          }
          if (uVar4 == 0xffffffff) break;
        }
        local_a0.m_value =
             (char *)((this->m_data).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start +
                     (this->m_entryTreeOffsets).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8]);
        local_d8 = (undefined1  [8])((ulong)uVar2 << 0x20);
        local_d0 = (char *)CONCAT44(0xffffffff,uVar4);
        uVar2 = BTree<EntryBTree,_EntryKey>::searchByKey
                          ((BTree<EntryBTree,_EntryKey> *)&local_a0,(EntryKey *)local_d8);
        if (uVar2 == 0xffffffff) break;
        uVar2 = local_d0._4_4_;
        uVar8 = (ulong)local_d0._4_4_;
        if (((ulong)local_d8 & 1) == 0) {
          if (local_d0._4_4_ != 0xffffffff) {
            local_d8 = (undefined1  [8])
                       ((this->m_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start + this->m_nodeTreeOffset);
            local_d0 = (char *)CONCAT71(local_d0._1_7_,
                                        1 < (ulong)(((long)(this->m_dataStreams).
                                                                                                                      
                                                  super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->m_dataStreams).
                                                                                                                
                                                  super__Vector_base<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 4) *
                                                  0x14c1bacf914c1bad));
            local_90->m_flags = 0;
            local_90->m_nodeIndex = uVar2;
            local_90->m_size1 = 0;
            local_90->m_size2 = 0;
            local_90->m_volumeIndex = 0xffffffff;
            local_90->m_sectorIndex = 0;
            uVar9 = BTree<NodeBTree,_NodeKey>::searchByKey
                              ((BTree<NodeBTree,_NodeKey> *)local_d8,local_90);
            goto LAB_0011c642;
          }
          break;
        }
        uVar10 = (ulong)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar10 < (ulong)((long)local_b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_b8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    uVar9 = 0xffffffff;
LAB_0011c642:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return uVar9;
}

Assistant:

unsigned int VolumeFile::getNodeByPath(const std::string& filePath, NodeKey& nodeKey) const
{
	if (m_entryTreeCount == 0) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const auto normalizedFilePath = normalizeFilePath(filePath);
	std::vector<std::string> parts;
	boost::algorithm::split(
		parts,
		normalizedFilePath,
		boost::algorithm::is_any_of("/"),
		boost::algorithm::token_compress_on
	);

	if (parts.empty()) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const StringBTree nameBtree(
		advancePointer(m_data.data(), nameTreeOffset())
	);
	const StringBTree extBtree(
		advancePointer(m_data.data(), extTreeOffset())
	);

	auto nodeIndex = NodeBTree::INVALID_INDEX;
	for (auto i = 0u, entryTreeIndex = 0u; i < parts.size(); ++i) {
		const auto& part = parts[i];
		const auto dotPos = part.find_last_of('.');
		
		const auto nameLength = (dotPos != std::string::npos) ? dotPos : part.size();
		StringKey nameKey(part.c_str(), static_cast<uint32_t>(nameLength));
		const auto nameIndex = nameBtree.searchByKey(nameKey);
		if (nameIndex == StringBTree::INVALID_INDEX) {
			break;
		}
		
		auto extIndex = 0u;
		if (dotPos != std::string::npos) {
			const auto extPart = part.substr(dotPos);
			const auto extLength = extPart.size();
			StringKey extKey(extPart.c_str(), static_cast<uint32_t>(extLength));
			extIndex = extBtree.searchByKey(extKey);
			if (extIndex == StringBTree::INVALID_INDEX) {
				break;
			}
		}
		
		const EntryBTree entryBtree(
			advancePointer(m_data.data(), entryTreeOffset(entryTreeIndex))
		);
		EntryKey entryKey(nameIndex, extIndex);
		const auto entryIndex = entryBtree.searchByKey(entryKey);
		if (entryIndex == EntryBTree::INVALID_INDEX) {
			break;
		}
		
		if (entryKey.isDirectory()) {
			entryTreeIndex = entryKey.linkIndex();
		} else {
			nodeIndex = entryKey.linkIndex();
			break;
		}
	}
	if (nodeIndex == NodeBTree::INVALID_INDEX) {
		return NodeBTree::INVALID_INDEX;
	}
	
	const NodeBTree nodeBtree(
		advancePointer(m_data.data(), nodeTreeOffset()),
		hasMultipleVolumes()
	);
	nodeKey = NodeKey(nodeIndex);
	nodeIndex = nodeBtree.searchByKey(nodeKey);
	if (nodeIndex == NodeBTree::INVALID_INDEX) {
		return NodeBTree::INVALID_INDEX;
	}
	
	return nodeIndex;
}